

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::FindHelper<false,true>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              int64 length,Arguments *args,ScriptContext *scriptContext)

{
  RecyclableObject *pRVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  double dVar4;
  bool bVar5;
  BOOL BVar6;
  Var pvVar7;
  RecyclableObject *this;
  undefined4 *puVar8;
  uint64 uVar9;
  uint64 uVar10;
  JavascriptMethod p_Var11;
  char16_t *varName;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 local_78 [8];
  JsReentLock jsReentLock;
  RecyclableObject *local_48;
  Var element;
  ScriptContext *local_38;
  
  local_78 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_78)->noJsReentrancy;
  ((ThreadContext *)local_78)->noJsReentrancy = true;
  element = typedArrayBase;
  local_38 = scriptContext;
  JsReentLock::setObjectForMutation((JsReentLock *)local_78,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00b9754f:
    varName = L"[TypedArray].prototype.find";
    if (element == (Var)0x0) {
      varName = L"Array.prototype.find";
    }
    JavascriptError::ThrowTypeError(local_38,-0x7ff5ec34,varName);
  }
  pvVar7 = Arguments::operator[](args,1);
  bVar5 = JavascriptConversion::IsCallable(pvVar7);
  if (!bVar5) goto LAB_00b9754f;
  pvVar7 = Arguments::operator[](args,1);
  this = VarTo<Js::RecyclableObject>(pvVar7);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    jsReentLock._24_8_ =
         (((local_38->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
         undefinedValue.ptr;
  }
  else {
    jsReentLock._24_8_ = Arguments::operator[](args,2);
  }
  if (pArr == (JavascriptArray *)0x0 && element == (Var)0x0) {
    bVar5 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    if (bVar5) {
      element = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    }
    else {
      element = (Var)0x0;
    }
LAB_00b97217:
    local_48 = (RecyclableObject *)0x0;
    uVar13 = (ulong)((int)length - 1);
    if (element == (Var)0x0) {
      *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      local_48 = (RecyclableObject *)
                 FindObjectHelper<false,true>(obj,length,0,this,(Var)jsReentLock._24_8_,local_38);
      goto LAB_00b9752e;
    }
    if (0xffffffff < length) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2148,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar5) {
LAB_00b97579:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
    if ((long)uVar13 < length) {
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        local_48 = (RecyclableObject *)(**(code **)(*element + 0x390))(element,uVar13);
        if ((int)uVar13 < 0) {
          dVar4 = (double)uVar13;
          uVar9 = NumberUtilities::ToSpecial(dVar4);
          bVar5 = NumberUtilities::IsNan(dVar4);
          if (((bVar5) && (uVar10 = NumberUtilities::ToSpecial(dVar4), uVar10 != 0xfff8000000000000)
              ) && (uVar10 = NumberUtilities::ToSpecial(dVar4), uVar10 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar5) goto LAB_00b97579;
            *puVar8 = 0;
          }
          uVar14 = uVar9 ^ 0xfffc000000000000;
        }
        else {
          uVar14 = uVar13 | 0x1000000000000;
        }
        *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pTVar2 = local_38->threadContext;
        bVar5 = pTVar2->reentrancySafeOrHandled;
        pTVar2->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
        if (local_38->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var11 = RecyclableObject::GetEntryPoint(this);
        CheckIsExecutable(this,p_Var11);
        p_Var11 = RecyclableObject::GetEntryPoint(this);
        pvVar7 = (*p_Var11)(this,(CallInfo)this,0x2000004,0,0,0,0,0x2000004,jsReentLock._24_8_,
                            local_48,uVar14,element);
        pTVar2->reentrancySafeOrHandled = bVar5;
        JsReentLock::MutateArrayObject((JsReentLock *)local_78);
        *(bool *)((long)local_78 + 0x108) = true;
        BVar6 = JavascriptConversion::ToBoolean(pvVar7,local_38);
        if (BVar6 != 0) goto LAB_00b9752e;
        uVar13 = (ulong)((int)uVar13 - 1);
      } while (uVar13 < (ulong)length);
    }
  }
  else {
    local_48 = (RecyclableObject *)0x0;
    if (pArr == (JavascriptArray *)0x0) goto LAB_00b97217;
    pRVar1 = (((local_38->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
    if (0xffffffff < length) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2125,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar5) goto LAB_00b97579;
      *puVar8 = 0;
    }
    uVar13 = (ulong)((int)length - 1);
    if ((long)uVar13 < length) {
      element = pArr;
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar14 = length & 0xffffffff;
      do {
        uVar12 = (int)uVar14 - 1;
        *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        local_48 = pRVar1;
        (**(code **)(*element + 0x388))(element,uVar12,&local_48);
        JsReentLock::MutateArrayObject((JsReentLock *)local_78);
        *(bool *)((long)local_78 + 0x108) = true;
        if ((int)uVar12 < 0) {
          dVar4 = (double)uVar12;
          uVar9 = NumberUtilities::ToSpecial(dVar4);
          bVar5 = NumberUtilities::IsNan(dVar4);
          if (((bVar5) && (uVar10 = NumberUtilities::ToSpecial(dVar4), uVar10 != 0xfff8000000000000)
              ) && (uVar10 = NumberUtilities::ToSpecial(dVar4), uVar10 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar5) goto LAB_00b97579;
            *puVar8 = 0;
          }
          uVar13 = uVar9 ^ 0xfffc000000000000;
        }
        else {
          uVar13 = uVar13 | 0x1000000000000;
        }
        *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pTVar2 = local_38->threadContext;
        bVar5 = pTVar2->reentrancySafeOrHandled;
        pTVar2->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
        if (local_38->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var11 = RecyclableObject::GetEntryPoint(this);
        CheckIsExecutable(this,p_Var11);
        p_Var11 = RecyclableObject::GetEntryPoint(this);
        pvVar7 = (*p_Var11)(this,(CallInfo)this,0x2000004,0,0,0,0,0x2000004,jsReentLock._24_8_,
                            local_48,uVar13,element);
        pTVar2->reentrancySafeOrHandled = bVar5;
        JsReentLock::MutateArrayObject((JsReentLock *)local_78);
        *(bool *)((long)local_78 + 0x108) = true;
        BVar6 = JavascriptConversion::ToBoolean(pvVar7,local_38);
        if (BVar6 != 0) goto LAB_00b9752e;
        bVar5 = IsNonES5Array(obj);
        if (!bVar5) {
          bVar5 = VarIs<Js::ES5Array,Js::RecyclableObject>(obj);
          if (!bVar5) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar8 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x2141,"(VarIs<ES5Array>(obj))",
                                        "The array should have been converted to an ES5Array");
            if (!bVar5) goto LAB_00b97579;
            *puVar8 = 0;
          }
          *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          local_48 = (RecyclableObject *)
                     FindObjectHelper<false,true>
                               (obj,length,uVar14,this,(Var)jsReentLock._24_8_,local_38);
          goto LAB_00b9752e;
        }
        uVar13 = (ulong)((int)uVar14 - 2);
        uVar14 = (ulong)uVar12;
      } while (uVar13 < (ulong)length);
    }
  }
  local_48 = (((local_38->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
LAB_00b9752e:
  *(undefined1 *)((long)local_78 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_48;
}

Assistant:

Var JavascriptArray::FindHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, int64 length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            // typedArrayBase is only non-null if and only if we came here via the TypedArray entrypoint
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, findIndex ? _u("[TypedArray].prototype.findIndex") : _u("[TypedArray].prototype.find"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, findIndex ? _u("Array.prototype.findIndex") : _u("Array.prototype.find"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.find/findIndex and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        CallFlags flags = CallFlags_Value;
        Var element = nullptr;
        Var testResult = nullptr;
        uint32 loopStart = reversed ? (uint32)length - 1 : 0;
        int8 loopDelta = reversed ? -1 : 1;

        if (pArr)
        {
            Var undefined = scriptContext->GetLibrary()->GetUndefined();

            Assert(length <= UINT_MAX);
            for (uint32 k = loopStart; k < length; k += loopDelta)
            {
                element = undefined;
                JS_REENTRANT(jsReentLock, pArr->DirectGetItemAtFull(k, &element));

                Var index = JavascriptNumber::ToVar(k, scriptContext);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(flags, 4), thisArg,
                                element,
                                index,
                                pArr);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return findIndex ? index : element;
                }

                // Side-effects in the callback function may have changed the source array into an ES5Array. If this happens
                // we will process the rest of the array elements like an ES5Array.
                if (!JavascriptArray::IsNonES5Array(obj))
                {
                    AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                    JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::FindObjectHelper<findIndex, reversed>(obj, length, k + 1, callBackFn, thisArg, scriptContext));
                }
            }
        }
        else if (typedArrayBase)
        {
            Assert(length <= UINT_MAX);
            for (uint32 k = loopStart; k < length; k+= loopDelta)
            {
                // Spec does not ask to call HasItem, so we need to go to visit the whole length

                element = typedArrayBase->DirectGetItem(k);

                Var index = JavascriptNumber::ToVar(k, scriptContext);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(flags, 4), thisArg,
                            element,
                            index,
                            typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return findIndex ? index : element;
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::FindObjectHelper<findIndex, reversed>(obj, length, 0u, callBackFn, thisArg, scriptContext));
        }

        return findIndex ? JavascriptNumber::ToVar(-1, scriptContext) : scriptContext->GetLibrary()->GetUndefined();
    }